

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

int cs_system_impl::get_file_type(string *path)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  stat s;
  stat sStack_a8;
  
  memset(&sStack_a8,0,0x90);
  iVar1 = stat((path->_M_dataplus)._M_p,&sStack_a8);
  iVar3 = 0;
  if ((iVar1 == 0) && (uVar2 = (sStack_a8.st_mode & 0xf000) - 0x1000, iVar3 = 0, uVar2 < 0xc000)) {
    iVar3 = *(int *)(&DAT_001eb070 + (uVar2 >> 10));
  }
  return iVar3;
}

Assistant:

int get_file_type(const std::string &path)
	{
		struct stat s {};
		if (stat(path.c_str(), &s) != 0) {
			return DT_UNKNOWN;
		}
		if (S_ISDIR(s.st_mode)) {
			return DT_DIR;
		}
		else if (S_ISREG(s.st_mode)) {
			return DT_REG;
		}
		else if (S_ISLNK(s.st_mode)) {
			return DT_LNK;
		}
		else if (S_ISFIFO(s.st_mode)) {
			return DT_FIFO;
		}
		else if (S_ISBLK(s.st_mode)) {
			return DT_BLK;
		}
		else if (S_ISCHR(s.st_mode)) {
			return DT_CHR;
		}
		else if (S_ISSOCK(s.st_mode)) {
			return DT_SOCK;
		}
		return DT_UNKNOWN;
	}